

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c5a51::ECCurveTest_SetAffine_Test::TestBody(ECCurveTest_SetAffine_Test *this)

{
  EC_GROUP *group;
  _Head_base<0UL,_bignum_st_*,_false> _Var1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *p_00;
  BIGNUM *pBVar4;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<EC_POINT> invalid_point;
  UniquePtr<BIGNUM> y;
  UniquePtr<EC_POINT> point;
  UniquePtr<BIGNUM> x;
  UniquePtr<BIGNUM> p;
  UniquePtr<EC_KEY> key;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  _Head_base<0UL,_ec_point_st_*,_false> local_68;
  AssertHelper local_60;
  string local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  _Head_base<0UL,_bignum_st_*,_false> local_20;
  _Head_base<0UL,_ec_key_st_*,_false> local_18;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  local_18._M_head_impl = (ec_key_st *)EC_KEY_new_by_curve_name(*pPVar3);
  local_80[0] = (internal)(local_18._M_head_impl != (ec_key_st *)0x0);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (ec_key_st *)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_80,(AssertionResult *)0x5e57b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x223,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_28);
  }
  else {
    iVar2 = EC_KEY_generate_key((EC_KEY *)local_18._M_head_impl);
    local_80[0] = (internal)(iVar2 != 0);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_80[0]) {
      local_28._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)BN_new();
      local_80[0] = (internal)((BIGNUM *)local_28._M_head_impl != (BIGNUM *)0x0);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BIGNUM *)local_28._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,local_80,(AssertionResult *)0x5928cd,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x228,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0) {
          (*(code *)(local_38._M_head_impl)->d[1])();
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
      }
      else {
        local_38._M_head_impl = (bignum_st *)BN_new();
        local_80[0] = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_20);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_58,local_80,(AssertionResult *)0x5a5c54,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x22a,local_58._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_20)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0) {
            (*(code *)(local_20._M_head_impl)->d[1])();
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
        }
        else {
          local_20._M_head_impl = (bignum_st *)BN_new();
          local_80[0] = (internal)((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_30);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_58,local_80,(AssertionResult *)0x54bfec,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x22c,local_58._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_68,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (local_30._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_30._M_head_impl + 8))();
            }
            if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,local_78);
            }
          }
          else {
            group = (this->super_ECCurveTest).group_;
            p_00 = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
            iVar2 = EC_POINT_get_affine_coordinates_GFp
                              ((EC_GROUP *)group,p_00,(BIGNUM *)local_28._M_head_impl,
                               (BIGNUM *)local_38._M_head_impl,(BN_CTX *)0x0);
            local_80[0] = (internal)(iVar2 != 0);
            local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_80[0]) {
              testing::Message::Message((Message *)&local_30);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,local_80,
                         (AssertionResult *)
                         "EC_POINT_get_affine_coordinates_GFp( group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x22e,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_68,(Message *)&local_30);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_30._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_30._M_head_impl + 8))();
              }
              if (local_78 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_78,local_78);
              }
            }
            iVar2 = EC_GROUP_get_curve_GFp
                              ((EC_GROUP *)(this->super_ECCurveTest).group_,
                               (BIGNUM *)local_20._M_head_impl,(BIGNUM *)0x0,(BIGNUM *)0x0,
                               (BN_CTX *)0x0);
            local_80[0] = (internal)(iVar2 != 0);
            local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_80[0]) {
              testing::Message::Message((Message *)&local_30);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,local_80,
                         (AssertionResult *)
                         "EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x230,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_68,(Message *)&local_30);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_30._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_30._M_head_impl + 8))();
              }
              if (local_78 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_78,local_78);
              }
            }
            local_30._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
            local_80[0] = (internal)
                          (local_30._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0);
            local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_30._M_head_impl ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              testing::Message::Message((Message *)&local_68);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,local_80,(AssertionResult *)0x533e0a,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x234,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_68._M_head_impl != (ec_point_st *)0x0) {
                (*(code *)((local_68._M_head_impl)->group->generator).group)();
              }
              if (local_78 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_78,local_78);
              }
            }
            else {
              iVar2 = EC_POINT_set_affine_coordinates_GFp
                                ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)local_30._M_head_impl,(BIGNUM *)local_28._M_head_impl,
                                 (BIGNUM *)local_38._M_head_impl,(BN_CTX *)0x0);
              local_80[0] = (internal)(iVar2 != 0);
              local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_80[0]) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,local_80,
                           (AssertionResult *)
                           "EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(), y.get(), nullptr)"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x236,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl != (ec_point_st *)0x0) {
                  (*(code *)((local_68._M_head_impl)->group->generator).group)();
                }
                if (local_78 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_78,local_78);
                }
              }
              _Var1._M_head_impl = local_38._M_head_impl;
              pBVar4 = BN_value_one();
              iVar2 = BN_sub((BIGNUM *)_Var1._M_head_impl,(BIGNUM *)_Var1._M_head_impl,pBVar4);
              local_80[0] = (internal)(iVar2 != 0);
              local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_80[0]) {
                testing::Message::Message((Message *)&local_68);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,local_80,
                           (AssertionResult *)"BN_sub(y.get(), y.get(), BN_value_one())","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x239,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if (local_68._M_head_impl != (ec_point_st *)0x0) {
                  (*(code *)((local_68._M_head_impl)->group->generator).group)();
                }
                if (local_78 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_78,local_78);
                }
              }
              local_68._M_head_impl =
                   (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              local_80[0] = (internal)(local_68._M_head_impl != (ec_point_st *)0x0);
              local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_68._M_head_impl == (ec_point_st *)0x0) {
                testing::Message::Message((Message *)&local_70);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,local_80,(AssertionResult *)"invalid_point","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x23d,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
LAB_002d4c3a:
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if (local_70.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_70.data_ + 8))();
                }
                if (local_78 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_78,local_78);
                }
              }
              else {
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_68._M_head_impl,(BIGNUM *)local_28._M_head_impl
                                   ,(BIGNUM *)local_38._M_head_impl,(BN_CTX *)0x0);
                local_80[0] = (internal)(iVar2 == 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_80[0]) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,local_80,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x23f,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_70.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_70.data_ + 8))();
                  }
                  if (local_78 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_78,local_78);
                  }
                }
                _Var1._M_head_impl = local_38._M_head_impl;
                pBVar4 = BN_value_one();
                iVar2 = BN_add((BIGNUM *)_Var1._M_head_impl,(BIGNUM *)_Var1._M_head_impl,pBVar4);
                local_80[0] = (internal)(iVar2 != 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_80[0]) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,local_80,
                             (AssertionResult *)"BN_add(y.get(), y.get(), BN_value_one())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x242,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_70.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_70.data_ + 8))();
                  }
                  if (local_78 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_78,local_78);
                  }
                }
                iVar2 = BN_add((BIGNUM *)local_38._M_head_impl,(BIGNUM *)local_38._M_head_impl,
                               (BIGNUM *)local_20._M_head_impl);
                local_80[0] = (internal)(iVar2 != 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_80[0]) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,local_80,
                             (AssertionResult *)"BN_add(y.get(), y.get(), p.get())","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x243,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_70.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_70.data_ + 8))();
                  }
                  if (local_78 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_78,local_78);
                  }
                }
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_68._M_head_impl,(BIGNUM *)local_28._M_head_impl
                                   ,(BIGNUM *)local_38._M_head_impl,(BN_CTX *)0x0);
                local_80[0] = (internal)(iVar2 == 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_80[0]) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,local_80,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x246,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                  testing::internal::AssertHelper::~AssertHelper(&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_70.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_70.data_ + 8))();
                  }
                  if (local_78 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_78,local_78);
                  }
                }
                iVar2 = EC_KEY_set_public_key_affine_coordinates
                                  ((EC_KEY *)local_18._M_head_impl,(BIGNUM *)local_28._M_head_impl,
                                   (BIGNUM *)local_38._M_head_impl);
                local_80[0] = (internal)(iVar2 == 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_80[0]) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,local_80,
                             (AssertionResult *)
                             "EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get())"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x248,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                  goto LAB_002d4c3a;
                }
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_68);
            }
            std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_30);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
      goto LAB_002d4cb3;
    }
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_80,(AssertionResult *)"EC_KEY_generate_key(key.get())","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x224,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_28);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_28._M_head_impl != (BIGNUM *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
LAB_002d4cb3:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_P(ECCurveTest, SetAffine) {
  // Generate an EC_KEY.
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  // Get the public key's coordinates.
  bssl::UniquePtr<BIGNUM> x(BN_new());
  ASSERT_TRUE(x);
  bssl::UniquePtr<BIGNUM> y(BN_new());
  ASSERT_TRUE(y);
  bssl::UniquePtr<BIGNUM> p(BN_new());
  ASSERT_TRUE(p);
  EXPECT_TRUE(EC_POINT_get_affine_coordinates_GFp(
      group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr));
  EXPECT_TRUE(
      EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr));

  // Points on the curve should be accepted.
  auto point = bssl::UniquePtr<EC_POINT>(EC_POINT_new(group()));
  ASSERT_TRUE(point);
  EXPECT_TRUE(EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(),
                                                  y.get(), nullptr));

  // Subtract one from |y| to make the point no longer on the curve.
  EXPECT_TRUE(BN_sub(y.get(), y.get(), BN_value_one()));

  // Points not on the curve should be rejected.
  bssl::UniquePtr<EC_POINT> invalid_point(EC_POINT_new(group()));
  ASSERT_TRUE(invalid_point);
  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));

  // Coordinates out of range should be rejected.
  EXPECT_TRUE(BN_add(y.get(), y.get(), BN_value_one()));
  EXPECT_TRUE(BN_add(y.get(), y.get(), p.get()));

  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));
  EXPECT_FALSE(
      EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get()));
}